

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O2

LazyObject * __thiscall Assimp::FBX::Connection::LazyDestinationObject(Connection *this)

{
  LazyObject *pLVar1;
  
  pLVar1 = Document::GetObject(this->doc,this->dest);
  if (pLVar1 != (LazyObject *)0x0) {
    return pLVar1;
  }
  __assert_fail("lazy",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXDocument.cpp"
                ,0x2b7,"LazyObject &Assimp::FBX::Connection::LazyDestinationObject() const");
}

Assistant:

LazyObject& Connection::LazyDestinationObject() const
{
    LazyObject* const lazy = doc.GetObject(dest);
    ai_assert(lazy);
    return *lazy;
}